

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ed25519-sha512.c
# Opt level: O0

_Bool ed25519_verify(uint8_t *sig,uint8_t *pub,uint8_t *data,size_t len)

{
  int iVar1;
  void *in_RDI;
  uint8_t check [32];
  sc_t S;
  sc_t t;
  ed C;
  ed A;
  uint8_t h [64];
  sha512 hash;
  ed *in_stack_00000708;
  limb_t *in_stack_00000710;
  limb_t *in_stack_00000718;
  ed *in_stack_00000720;
  undefined1 auStack_2f8 [8];
  size_t in_stack_fffffffffffffd10;
  uint8_t *in_stack_fffffffffffffd18;
  sha512 *in_stack_fffffffffffffd20;
  size_t in_stack_fffffffffffffd80;
  ed *in_stack_fffffffffffffd88;
  limb_t *in_stack_fffffffffffffd90;
  uint8_t *in_stack_fffffffffffffde8;
  ed *in_stack_fffffffffffffdf0;
  limb_t local_1d8 [10];
  limb_t alStack_188 [19];
  sha512 local_f0;
  void *local_8;
  
  local_8 = in_RDI;
  ed_import(in_stack_fffffffffffffdf0,in_stack_fffffffffffffde8);
  sc_import(in_stack_fffffffffffffd90,(uint8_t *)in_stack_fffffffffffffd88,in_stack_fffffffffffffd80
           );
  sha512_init(&local_f0);
  sha512_add(in_stack_fffffffffffffd20,in_stack_fffffffffffffd18,in_stack_fffffffffffffd10);
  sha512_add(in_stack_fffffffffffffd20,in_stack_fffffffffffffd18,in_stack_fffffffffffffd10);
  sha512_add(in_stack_fffffffffffffd20,in_stack_fffffffffffffd18,in_stack_fffffffffffffd10);
  sha512_final(in_stack_fffffffffffffd20,in_stack_fffffffffffffd18);
  sc_import(in_stack_fffffffffffffd90,(uint8_t *)in_stack_fffffffffffffd88,in_stack_fffffffffffffd80
           );
  fld_neg(local_1d8,local_1d8);
  fld_neg(alStack_188,alStack_188);
  ed_dual_scale(in_stack_00000720,in_stack_00000718,in_stack_00000710,in_stack_00000708);
  ed_export((uint8_t *)in_stack_fffffffffffffd90,in_stack_fffffffffffffd88);
  iVar1 = memcmp(auStack_2f8,local_8,0x20);
  return iVar1 == 0;
}

Assistant:

bool
ed25519_verify(const uint8_t sig[ED25519_SIG_LEN],
	       const uint8_t pub[ED25519_KEY_LEN],
	       const uint8_t *data, size_t len)
{
	struct sha512 hash;
	uint8_t h[SHA512_HASH_LENGTH];
	struct ed A, C;
	sc_t t, S;
	uint8_t check[32];

	/* import public key */
	ed_import(&A, pub);

	/* import S from second half of the signature */
	sc_import(S, sig+32, 32);

	/* calculate t := Hash(export(R), export(A), data) mod m */
	sha512_init(&hash);
	sha512_add(&hash, sig, 32);
	sha512_add(&hash, pub, 32);
	sha512_add(&hash, data, len);
	sha512_final(&hash, h);
	sc_import(t, h, 64);

	/* verify signature (vartime!) */
	fld_neg(A.x, A.x);
	fld_neg(A.t, A.t);
	ed_dual_scale(&C, S, t, &A);
	ed_export(check, &C);
	
	/* is export(C) == export(R) (vartime!) */
	return (memcmp(check, sig, 32) == 0);
}